

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc.cpp
# Opt level: O2

char * uloc_toLegacyType_63(char *keyword,char *value)

{
  byte c;
  UBool UVar1;
  char *pcVar2;
  char *p;
  byte *pbVar3;
  int iVar4;
  bool bVar5;
  
  iVar4 = 0;
  pcVar2 = ulocimp_toLegacyType_63(keyword,value,(UBool *)0x0,(UBool *)0x0);
  pbVar3 = (byte *)value;
  if (pcVar2 != (char *)0x0) {
    return pcVar2;
  }
  do {
    c = *pbVar3;
    if ((c - 0x2d < 0x33) && ((0x4000000000005U >> ((ulong)(c - 0x2d) & 0x3f) & 1) != 0)) {
      bVar5 = iVar4 == 0;
      iVar4 = 0;
      if (bVar5) {
        return (char *)0x0;
      }
    }
    else {
      if (c == 0) {
        if (iVar4 == 0) {
          return (char *)0x0;
        }
        return value;
      }
      UVar1 = uprv_isASCIILetter_63(c);
      if ((UVar1 == '\0') && (9 < (byte)(*pbVar3 - 0x30))) {
        return (char *)0x0;
      }
      iVar4 = iVar4 + 1;
    }
    pbVar3 = pbVar3 + 1;
  } while( true );
}

Assistant:

U_CAPI const char* U_EXPORT2
uloc_toLegacyType(const char* keyword, const char* value)
{
    const char* legacyType = ulocimp_toLegacyType(keyword, value, NULL, NULL);
    if (legacyType == NULL) {
        // Checks if the specified locale type is well-formed with the legacy locale syntax.
        //
        // Note:
        //  LDML/CLDR provides some definition of keyword syntax in
        //  * http://www.unicode.org/reports/tr35/#Unicode_locale_identifier and
        //  * http://www.unicode.org/reports/tr35/#Old_Locale_Extension_Syntax
        //  Values (types) can only consist of [0-9a-zA-Z], plus for legacy values
        //  we allow [/_-+] in the middle (e.g. "Etc/GMT+1", "Asia/Tel_Aviv")
        if (isWellFormedLegacyType(value)) {
            return value;
        }
    }
    return legacyType;
}